

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Subscription_publishCallback(UA_Server *server,UA_Subscription *sub)

{
  UA_PublishResponse *content;
  uint uVar1;
  UA_PublishResponseEntry *pUVar2;
  ulong uVar3;
  MonitoredItem_queuedValue *pMVar4;
  MonitoredItem_queuedValue **ppMVar5;
  UA_NotificationMessageEntry *pUVar6;
  UA_NotificationMessageEntry *pUVar7;
  UA_NotificationMessageEntry **ppUVar8;
  size_t size;
  UA_StatusCode *p;
  UA_ServerConfig *pUVar9;
  anon_struct_16_2_4dd83919_for_listEntry *paVar10;
  undefined4 uVar11;
  UA_Server *server_00;
  UA_UInt32 UVar12;
  uint uVar13;
  UA_MonitoredItem *pUVar14;
  UA_DateTime UVar15;
  UA_ExtensionObject *pUVar16;
  void *pvVar17;
  MonitoredItem_queuedValue *__ptr;
  UA_UInt32 *pUVar18;
  MonitoredItem_queuedValue *in_RCX;
  long lVar19;
  UA_NotificationMessageEntry *pUVar20;
  ulong uVar21;
  MonitoredItem_queuedValue ****ppppMVar22;
  UA_DataValue *pUVar23;
  MonitoredItem_queuedValue ***pppMVar24;
  undefined8 *puVar25;
  UA_Logger logger;
  long lVar26;
  UA_SecureChannel *pUVar27;
  UA_Session *pUVar28;
  UA_Boolean UVar29;
  ulong uVar30;
  byte bVar31;
  MonitoredItem_queuedValue ***local_78;
  ulong *local_70;
  undefined4 local_64;
  UA_NotificationMessage *local_60;
  UA_NotificationMessageEntry *local_58;
  MonitoredItem_queuedValue *local_50;
  UA_MonitoredItem *local_48;
  UA_PublishResponseEntry *local_40;
  UA_Server *local_38;
  
  bVar31 = 0;
  ppppMVar22 = &local_78;
  pUVar28 = sub->session;
  pUVar27 = pUVar28->channel;
  if (sub->publishingEnabled == true) {
    pUVar14 = (UA_MonitoredItem *)&sub->monitoredItems;
    UVar29 = false;
    uVar30 = 0;
LAB_001210a7:
    pUVar14 = (pUVar14->listEntry).le_next;
    if (pUVar14 != (UA_MonitoredItem *)0x0) {
      in_RCX = (MonitoredItem_queuedValue *)&pUVar14->queue;
      while (in_RCX = (in_RCX->listEntry).tqe_next, in_RCX != (MonitoredItem_queuedValue *)0x0) {
        if (sub->notificationsPerPublish <= uVar30) {
          UVar29 = true;
          break;
        }
        uVar30 = uVar30 + 1;
      }
      goto LAB_001210a7;
    }
    if (uVar30 == 0) goto LAB_001210de;
    local_64 = 0;
  }
  else {
    UVar29 = false;
LAB_001210de:
    uVar13 = sub->currentKeepAliveCount + 1;
    sub->currentKeepAliveCount = uVar13;
    if (uVar13 < sub->maxKeepAliveCount) {
      return;
    }
    local_64 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    uVar30 = 0;
  }
  if (pUVar27 == (UA_SecureChannel *)0x0) {
    return;
  }
  local_40 = (pUVar28->responseQueue).sqh_first;
  local_38 = server;
  if (local_40 == (UA_PublishResponseEntry *)0x0) {
    if (sub->state != UA_SUBSCRIPTIONSTATE_LATE) {
      sub->state = UA_SUBSCRIPTIONSTATE_LATE;
      return;
    }
    uVar13 = sub->currentLifetimeCount + 1;
    sub->currentLifetimeCount = uVar13;
    if (uVar13 <= sub->lifeTimeCount) {
      return;
    }
    UA_Session_deleteSubscription(server,pUVar28,sub->subscriptionID);
    return;
  }
  local_60 = &(local_40->response).notificationMessage;
  if ((char)local_64 != '\0') {
    pUVar20 = (UA_NotificationMessageEntry *)0x0;
LAB_0012112a:
    pUVar28 = sub->session;
    pUVar2 = (((pUVar28->responseQueue).sqh_first)->listEntry).sqe_next;
    (pUVar28->responseQueue).sqh_first = pUVar2;
    if (pUVar2 == (UA_PublishResponseEntry *)0x0) {
      (pUVar28->responseQueue).sqh_last = &(pUVar28->responseQueue).sqh_first;
    }
    UVar15 = UA_DateTime_now();
    (local_40->response).responseHeader.timestamp = UVar15;
    (local_40->response).subscriptionId = sub->subscriptionID;
    (local_40->response).moreNotifications = UVar29;
    (local_40->response).notificationMessage.publishTime = UVar15;
    UVar12 = sub->sequenceNumber + 1;
    if ((char)local_64 == '\0') {
      sub->sequenceNumber = UVar12;
      local_60->sequenceNumber = UVar12;
      pUVar16 = local_60->notificationData;
      (pUVar20->message).notificationDataSize = local_60->notificationDataSize;
      (pUVar20->message).notificationData = pUVar16;
      uVar11 = *(undefined4 *)&local_60->field_0x4;
      UVar15 = local_60->publishTime;
      (pUVar20->message).sequenceNumber = local_60->sequenceNumber;
      *(undefined4 *)&(pUVar20->message).field_0x4 = uVar11;
      (pUVar20->message).publishTime = UVar15;
      uVar13 = (local_38->config).maxRetransmissionQueueSize;
      if ((uVar13 != 0) && (uVar1 = sub->retransmissionQueueSize, uVar13 <= uVar1)) {
        pUVar6 = ((sub->retransmissionQueue).tqh_last[1]->listEntry).tqe_next;
        pUVar7 = (pUVar6->listEntry).tqe_next;
        ppUVar8 = (pUVar6->listEntry).tqe_prev;
        paVar10 = &pUVar7->listEntry;
        if (pUVar7 == (UA_NotificationMessageEntry *)0x0) {
          paVar10 = (anon_struct_16_2_4dd83919_for_listEntry *)&sub->retransmissionQueue;
        }
        paVar10->tqe_prev = ppUVar8;
        *ppUVar8 = pUVar7;
        sub->retransmissionQueueSize = uVar1 - 1;
        UA_NotificationMessage_deleteMembers(&pUVar6->message);
        free(pUVar6);
      }
      pUVar6 = (sub->retransmissionQueue).tqh_first;
      (pUVar20->listEntry).tqe_next = pUVar6;
      paVar10 = &pUVar6->listEntry;
      if (pUVar6 == (UA_NotificationMessageEntry *)0x0) {
        paVar10 = (anon_struct_16_2_4dd83919_for_listEntry *)&sub->retransmissionQueue;
      }
      paVar10->tqe_prev = (UA_NotificationMessageEntry **)pUVar20;
      (sub->retransmissionQueue).tqh_first = pUVar20;
      (pUVar20->listEntry).tqe_prev = &(sub->retransmissionQueue).tqh_first;
      uVar13 = sub->retransmissionQueueSize + 1;
      sub->retransmissionQueueSize = uVar13;
    }
    else {
      local_60->sequenceNumber = UVar12;
      uVar13 = sub->retransmissionQueueSize;
    }
    content = &local_40->response;
    if (uVar13 != 0) {
      ppppMVar22 = (MonitoredItem_queuedValue ****)
                   ((long)&local_78 - ((ulong)uVar13 * 4 + 0xf & 0xfffffffffffffff0));
      (local_40->response).availableSequenceNumbers = (UA_UInt32 *)ppppMVar22;
      (local_40->response).availableSequenceNumbersSize = (ulong)uVar13;
      pUVar20 = (UA_NotificationMessageEntry *)&sub->retransmissionQueue;
      pUVar18 = (UA_UInt32 *)ppppMVar22;
      while (pUVar20 = (pUVar20->listEntry).tqe_next, pUVar20 != (UA_NotificationMessageEntry *)0x0)
      {
        *pUVar18 = (pUVar20->message).sequenceNumber;
        pUVar18 = pUVar18 + 1;
      }
    }
    pUVar2 = local_40;
    pUVar27 = sub->session->channel;
    UVar12 = local_40->requestId;
    *(UA_UInt32 *)((long)ppppMVar22 + -8) = 0x12141c;
    *(UA_UInt32 *)((long)ppppMVar22 + -4) = 0;
    UA_SecureChannel_sendBinaryMessage(pUVar27,UVar12,content,UA_TYPES + 0x4e);
    sub->state = UA_SUBSCRIPTIONSTATE_NORMAL;
    sub->currentKeepAliveCount = 0;
    sub->currentLifetimeCount = 0;
    size = (pUVar2->response).resultsSize;
    p = (pUVar2->response).results;
    *(UA_UInt32 *)((long)ppppMVar22 + -8) = 0x12143f;
    *(UA_UInt32 *)((long)ppppMVar22 + -4) = 0;
    UA_Array_delete(p,size,UA_TYPES + 6);
    *(UA_UInt32 *)((long)ppppMVar22 + -8) = 0x121447;
    *(UA_UInt32 *)((long)ppppMVar22 + -4) = 0;
    free(pUVar2);
    server_00 = local_38;
    if (UVar29 != false) {
      *(UA_UInt32 *)((long)ppppMVar22 + -8) = 0x12145d;
      *(UA_UInt32 *)((long)ppppMVar22 + -4) = 0;
      UA_Subscription_publishCallback(server_00,sub);
    }
    return;
  }
  local_58 = (UA_NotificationMessageEntry *)malloc(0x30);
  if (local_58 == (UA_NotificationMessageEntry *)0x0) {
    pUVar9 = &local_38->config;
    if (pUVar27->connection == (UA_Connection *)0x0) {
      uVar30 = 0;
    }
    else {
      uVar30 = (ulong)(uint)pUVar27->connection->sockfd;
    }
    local_38 = (UA_Server *)(ulong)(pUVar28->sessionId).identifier.guid.data2;
    local_50 = (MonitoredItem_queuedValue *)(ulong)(pUVar28->sessionId).identifier.guid.data3;
    local_40 = (UA_PublishResponseEntry *)(ulong)(pUVar28->sessionId).identifier.guid.data4[0];
    local_48 = (UA_MonitoredItem *)(ulong)(pUVar28->sessionId).identifier.guid.data4[1];
    UA_LOG_WARNING(pUVar9->logger,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not allocate memory for retransmission"
                   ,uVar30,(ulong)(pUVar27->securityToken).channelId,
                   (ulong)(pUVar28->sessionId).identifier.numeric,local_38,local_50,local_40,
                   local_48,(ulong)(pUVar28->sessionId).identifier.guid.data4[2],
                   (ulong)(pUVar28->sessionId).identifier.guid.data4[3],
                   (ulong)(pUVar28->sessionId).identifier.guid.data4[4],
                   (ulong)(pUVar28->sessionId).identifier.guid.data4[5],
                   (ulong)(pUVar28->sessionId).identifier.guid.data4[6],
                   (ulong)(pUVar28->sessionId).identifier.guid.data4[7],(ulong)sub->subscriptionID);
    return;
  }
  pUVar16 = (UA_ExtensionObject *)UA_Array_new(1,UA_TYPES + 0x15);
  (local_40->response).notificationMessage.notificationData = pUVar16;
  if (pUVar16 == (UA_ExtensionObject *)0x0) {
    logger = (local_38->config).logger;
  }
  else {
    (local_40->response).notificationMessage.notificationDataSize = 1;
    local_70 = (ulong *)UA_new(UA_TYPES + 0x71);
    if (local_70 != (ulong *)0x0) {
      pUVar16->encoding = UA_EXTENSIONOBJECT_DECODED;
      (pUVar16->content).decoded.data = local_70;
      (pUVar16->content).decoded.type = (UA_DataType *)0x13c8c0;
      pvVar17 = UA_Array_new(uVar30,UA_TYPES + 0x42);
      local_70[1] = (ulong)pvVar17;
      if (pvVar17 != (void *)0x0) {
        *local_70 = uVar30;
        uVar21 = 0;
        pUVar14 = (UA_MonitoredItem *)&sub->monitoredItems;
        while (pUVar14 = (pUVar14->listEntry).le_next, pUVar20 = local_58,
              pUVar14 != (UA_MonitoredItem *)0x0) {
          local_78 = &(pUVar14->queue).tqh_last;
          lVar26 = uVar21 * 0x68 + 8;
          __ptr = (pUVar14->queue).tqh_first;
          local_48 = pUVar14;
          while (pUVar14 = local_48, __ptr != (MonitoredItem_queuedValue *)0x0) {
            pUVar20 = local_58;
            if (uVar30 <= uVar21) goto LAB_0012112a;
            local_50 = (__ptr->listEntry).tqe_next;
            uVar3 = local_70[1];
            *(UA_UInt32 *)((uVar3 - 8) + lVar26) = __ptr->clientHandle;
            pUVar23 = &__ptr->value;
            puVar25 = (undefined8 *)(uVar3 + lVar26);
            for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
              *puVar25 = *(undefined8 *)pUVar23;
              pUVar23 = (UA_DataValue *)((long)pUVar23 + ((ulong)bVar31 * -2 + 1) * 8);
              puVar25 = puVar25 + (ulong)bVar31 * -2 + 1;
            }
            pMVar4 = (__ptr->listEntry).tqe_next;
            ppMVar5 = (__ptr->listEntry).tqe_prev;
            pppMVar24 = &(pMVar4->listEntry).tqe_prev;
            if (pMVar4 == (MonitoredItem_queuedValue *)0x0) {
              pppMVar24 = local_78;
            }
            *pppMVar24 = ppMVar5;
            *ppMVar5 = pMVar4;
            free(__ptr);
            local_48->currentQueueSize = local_48->currentQueueSize - 1;
            uVar21 = uVar21 + 1;
            lVar26 = lVar26 + 0x68;
            __ptr = local_50;
          }
        }
        goto LAB_0012112a;
      }
    }
    UA_NotificationMessage_deleteMembers(local_60);
    pUVar28 = sub->session;
    pUVar27 = pUVar28->channel;
    logger = (local_38->config).logger;
    if (pUVar27 == (UA_SecureChannel *)0x0) {
      uVar30 = 0;
      uVar21 = 0;
      goto LAB_001214de;
    }
  }
  if (pUVar27->connection == (UA_Connection *)0x0) {
    uVar30 = 0;
  }
  else {
    uVar30 = (ulong)(uint)pUVar27->connection->sockfd;
  }
  uVar21 = (ulong)(pUVar27->securityToken).channelId;
LAB_001214de:
  local_38 = (UA_Server *)(ulong)(pUVar28->sessionId).identifier.guid.data2;
  local_50 = (MonitoredItem_queuedValue *)(ulong)(pUVar28->sessionId).identifier.guid.data3;
  local_40 = (UA_PublishResponseEntry *)(ulong)(pUVar28->sessionId).identifier.guid.data4[0];
  local_48 = (UA_MonitoredItem *)(ulong)(pUVar28->sessionId).identifier.guid.data4[1];
  UA_LOG_WARNING(logger,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not prepare the notification message"
                 ,uVar30,uVar21,(ulong)(pUVar28->sessionId).identifier.numeric,local_38,local_50,
                 local_40,local_48,(ulong)(pUVar28->sessionId).identifier.guid.data4[2],
                 (ulong)(pUVar28->sessionId).identifier.guid.data4[3],
                 (ulong)(pUVar28->sessionId).identifier.guid.data4[4],
                 (ulong)(pUVar28->sessionId).identifier.guid.data4[5],
                 (ulong)(pUVar28->sessionId).identifier.guid.data4[6],
                 (ulong)(pUVar28->sessionId).identifier.guid.data4[7],(ulong)sub->subscriptionID);
  free(local_58);
  return;
}

Assistant:

void UA_Subscription_publishCallback(UA_Server *server, UA_Subscription *sub) {
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session, "Subscription %u | "
                         "Publish Callback", sub->subscriptionID);

    /* Count the available notifications */
    UA_Boolean moreNotifications = false;
    size_t notifications = countQueuedNotifications(sub, &moreNotifications);

    /* Return if nothing to do */
    if(notifications == 0) {
        ++sub->currentKeepAliveCount;
        if(sub->currentKeepAliveCount < sub->maxKeepAliveCount)
            return;
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | Sending a KeepAlive",
                             sub->subscriptionID)
    }

    /* Check if the securechannel is valid */
    UA_SecureChannel *channel = sub->session->channel;
    if(!channel)
        return;

    /* Dequeue a response */
    UA_PublishResponseEntry *pre = SIMPLEQ_FIRST(&sub->session->responseQueue);

    /* Cannot publish without a response */
    if(!pre) {
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | Cannot send a publish response "
                             "since the publish queue is empty", sub->subscriptionID)
        if(sub->state != UA_SUBSCRIPTIONSTATE_LATE) {
            sub->state = UA_SUBSCRIPTIONSTATE_LATE;
        } else {
            ++sub->currentLifetimeCount;
            if(sub->currentLifetimeCount > sub->lifeTimeCount) {
                UA_LOG_DEBUG_SESSION(server->config.logger, sub->session, "Subscription %u | "
                                     "End of lifetime for subscription", sub->subscriptionID);
                UA_Session_deleteSubscription(server, sub->session, sub->subscriptionID);
            }
        }
        return;
    }

    UA_PublishResponse *response = &pre->response;
    UA_NotificationMessage *message = &response->notificationMessage;
    UA_NotificationMessageEntry *retransmission = NULL;
    if(notifications > 0) {
        /* Allocate the retransmission entry */
        retransmission = UA_malloc(sizeof(UA_NotificationMessageEntry));
        if(!retransmission) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | Could not allocate memory "
                                   "for retransmission", sub->subscriptionID);
            return;
        }
        /* Prepare the response */
        UA_StatusCode retval =
            prepareNotificationMessage(sub, message, notifications);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | Could not prepare the "
                                   "notification message", sub->subscriptionID);
            UA_free(retransmission);
            return;
        }
    }

    /* <-- The point of no return --> */

    /* Remove the response from the response queue */
    SIMPLEQ_REMOVE_HEAD(&sub->session->responseQueue, listEntry);

    /* Set up the response */
    response->responseHeader.timestamp = UA_DateTime_now();
    response->subscriptionId = sub->subscriptionID;
    response->moreNotifications = moreNotifications;
    message->publishTime = response->responseHeader.timestamp;
    if(notifications == 0) {
        /* Send sequence number for the next notification */
        message->sequenceNumber = sub->sequenceNumber + 1;
    } else {
        /* Increase the sequence number */
        message->sequenceNumber = ++sub->sequenceNumber;

        /* Put the notification message into the retransmission queue. This needs to
         * be done here, so that the message itself is included in the available
         * sequence numbers for acknowledgement. */
        retransmission->message = response->notificationMessage;
        UA_Subscription_addRetransmissionMessage(server, sub, retransmission);
    }

    /* Get the available sequence numbers from the retransmission queue */
    size_t available = sub->retransmissionQueueSize;
    if(available > 0) {
        response->availableSequenceNumbers = UA_alloca(available * sizeof(UA_UInt32));
        response->availableSequenceNumbersSize = available;
        size_t i = 0;
        UA_NotificationMessageEntry *nme;
        TAILQ_FOREACH(nme, &sub->retransmissionQueue, listEntry) {
            response->availableSequenceNumbers[i] = nme->message.sequenceNumber;
            ++i;
        }
    }

    /* Send the response */
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | Sending out a publish response with %u "
                         "notifications", sub->subscriptionID, (UA_UInt32)notifications);
    UA_SecureChannel_sendBinaryMessage(sub->session->channel, pre->requestId, response,
                                       &UA_TYPES[UA_TYPES_PUBLISHRESPONSE]);

    /* Reset subscription state to normal. */
    sub->state = UA_SUBSCRIPTIONSTATE_NORMAL;
    sub->currentKeepAliveCount = 0;
    sub->currentLifetimeCount = 0;

    /* Free the response */
    UA_Array_delete(response->results, response->resultsSize,
                    &UA_TYPES[UA_TYPES_UINT32]);
    UA_free(pre); /* no need for UA_PublishResponse_deleteMembers */

    /* Repeat if there are more notifications to send */
    if(moreNotifications)
        UA_Subscription_publishCallback(server, sub);
}